

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::FileOptions::ByteSizeLong(FileOptions *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  type_conflict tVar4;
  FileOptions_OptimizeMode value;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this_00;
  reference value_00;
  uint32_t *puVar5;
  string *psVar6;
  size_t sVar7;
  UninterpretedOption *msg;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *__range3;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  FileOptions *this_;
  FileOptions *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar3 = _internal_uninterpreted_option_size(this);
  sStack_58 = (long)iVar3 * 2 + sStack_58;
  this_00 = _internal_uninterpreted_option(this);
  __end3 = RepeatedPtrField<google::protobuf::UninterpretedOption>::begin(this_00);
  msg = (UninterpretedOption *)RepeatedPtrField<google::protobuf::UninterpretedOption>::end(this_00)
  ;
  while (bVar2 = internal::operator!=(&__end3,(iterator *)&msg), bVar2) {
    value_00 = internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption>::operator*
                         (&__end3);
    sVar7 = internal::WireFormatLite::MessageSize<google::protobuf::UninterpretedOption>(value_00);
    sStack_58 = sVar7 + sStack_58;
    internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption>::operator++(&__end3);
  }
  puVar5 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar5;
  tVar4 = absl::lts_20250127::popcount<unsigned_int>(uVar1 & 0xbf000);
  sStack_58 = (long)(int)((uint)((uVar1 & 0x800) != 0) << 1) + (long)(tVar4 * 3) + sStack_58;
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar6 = _internal_java_package_abi_cxx11_(this);
      sVar7 = internal::WireFormatLite::StringSize(psVar6);
      sStack_58 = sVar7 + 1 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      psVar6 = _internal_java_outer_classname_abi_cxx11_(this);
      sVar7 = internal::WireFormatLite::StringSize(psVar6);
      sStack_58 = sVar7 + 1 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      psVar6 = _internal_go_package_abi_cxx11_(this);
      sVar7 = internal::WireFormatLite::StringSize(psVar6);
      sStack_58 = sVar7 + 1 + sStack_58;
    }
    if ((uVar1 & 8) != 0) {
      psVar6 = _internal_objc_class_prefix_abi_cxx11_(this);
      sVar7 = internal::WireFormatLite::StringSize(psVar6);
      sStack_58 = sVar7 + 2 + sStack_58;
    }
    if ((uVar1 & 0x10) != 0) {
      psVar6 = _internal_csharp_namespace_abi_cxx11_(this);
      sVar7 = internal::WireFormatLite::StringSize(psVar6);
      sStack_58 = sVar7 + 2 + sStack_58;
    }
    if ((uVar1 & 0x20) != 0) {
      psVar6 = _internal_swift_prefix_abi_cxx11_(this);
      sVar7 = internal::WireFormatLite::StringSize(psVar6);
      sStack_58 = sVar7 + 2 + sStack_58;
    }
    if ((uVar1 & 0x40) != 0) {
      psVar6 = _internal_php_class_prefix_abi_cxx11_(this);
      sVar7 = internal::WireFormatLite::StringSize(psVar6);
      sStack_58 = sVar7 + 2 + sStack_58;
    }
    if ((uVar1 & 0x80) != 0) {
      psVar6 = _internal_php_namespace_abi_cxx11_(this);
      sVar7 = internal::WireFormatLite::StringSize(psVar6);
      sStack_58 = sVar7 + 2 + sStack_58;
    }
  }
  if ((uVar1 & 0x700) != 0) {
    if ((uVar1 & 0x100) != 0) {
      psVar6 = _internal_php_metadata_namespace_abi_cxx11_(this);
      sVar7 = internal::WireFormatLite::StringSize(psVar6);
      sStack_58 = sVar7 + 2 + sStack_58;
    }
    if ((uVar1 & 0x200) != 0) {
      psVar6 = _internal_ruby_package_abi_cxx11_(this);
      sVar7 = internal::WireFormatLite::StringSize(psVar6);
      sStack_58 = sVar7 + 2 + sStack_58;
    }
    if ((uVar1 & 0x400) != 0) {
      sVar7 = internal::WireFormatLite::MessageSize<google::protobuf::FeatureSet>
                        ((this->field_0)._impl_.features_);
      sStack_58 = sVar7 + 2 + sStack_58;
    }
  }
  if ((uVar1 & 0x40000) != 0) {
    value = _internal_optimize_for(this);
    sVar7 = internal::WireFormatLite::EnumSize(value);
    sStack_58 = sVar7 + 1 + sStack_58;
  }
  sVar7 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar7;
}

Assistant:

::size_t FileOptions::ByteSizeLong() const {
  const FileOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.FileOptions)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
    {
      total_size += 2UL * this_._internal_uninterpreted_option_size();
      for (const auto& msg : this_._internal_uninterpreted_option()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += ::absl::popcount(0x000bf000u & cached_has_bits) * 3;
  total_size += static_cast<bool>(0x00000800u & cached_has_bits) * 2;
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // optional string java_package = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_java_package());
    }
    // optional string java_outer_classname = 8;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_java_outer_classname());
    }
    // optional string go_package = 11;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_go_package());
    }
    // optional string objc_class_prefix = 36;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_objc_class_prefix());
    }
    // optional string csharp_namespace = 37;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_csharp_namespace());
    }
    // optional string swift_prefix = 39;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_swift_prefix());
    }
    // optional string php_class_prefix = 40;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_php_class_prefix());
    }
    // optional string php_namespace = 41;
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_php_namespace());
    }
  }
  if ((cached_has_bits & 0x00000700u) != 0) {
    // optional string php_metadata_namespace = 44;
    if ((cached_has_bits & 0x00000100u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_php_metadata_namespace());
    }
    // optional string ruby_package = 45;
    if ((cached_has_bits & 0x00000200u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_ruby_package());
    }
    // optional .google.protobuf.FeatureSet features = 50;
    if ((cached_has_bits & 0x00000400u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.features_);
    }
  }
   {
    // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
    if ((cached_has_bits & 0x00040000u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optimize_for());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}